

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMBasicBlockRef GetLoopContinueBlock(LlvmCompilationContext *ctx,uint depth)

{
  LoopInfo *pLVar1;
  uint index;
  uint i;
  uint uVar2;
  
  index = (ctx->loopInfo).count;
  for (uVar2 = 0; uVar2 != depth; uVar2 = uVar2 + 1) {
    do {
      index = index - 1;
      pLVar1 = SmallArray<LlvmCompilationContext::LoopInfo,_32U>::operator[](&ctx->loopInfo,index);
    } while (pLVar1->continueBlock == (LLVMBasicBlockRef)0x0);
  }
  pLVar1 = SmallArray<LlvmCompilationContext::LoopInfo,_32U>::operator[](&ctx->loopInfo,index);
  return pLVar1->continueBlock;
}

Assistant:

LLVMBasicBlockRef GetLoopContinueBlock(LlvmCompilationContext &ctx, unsigned depth)
{
	unsigned pos = ctx.loopInfo.size();

	for(unsigned i = 0; i < depth; i++)
	{
		pos--;

		while(!ctx.loopInfo[pos].continueBlock)
			pos--;
	}

	return ctx.loopInfo[pos].continueBlock;
}